

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNameTreeObjectHelper.cc
# Opt level: O0

int __thiscall QPDFNameTreeObjectHelper::remove(QPDFNameTreeObjectHelper *this,char *__filename)

{
  int iVar1;
  __shared_ptr_access<NNTreeImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  undefined8 extraout_RAX;
  QPDFObjectHandle local_30;
  QPDFObjectHandle *value_local;
  string *key_local;
  QPDFNameTreeObjectHelper *this_local;
  
  value_local = (QPDFObjectHandle *)__filename;
  key_local = (string *)this;
  this_00 = (__shared_ptr_access<NNTreeImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            std::
            __shared_ptr_access<QPDFNameTreeObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<QPDFNameTreeObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->m);
  this_01 = std::__shared_ptr_access<NNTreeImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->(this_00);
  QPDFObjectHandle::newUnicodeString(&local_30,(string *)value_local);
  iVar1 = NNTreeImpl::remove(this_01,(char *)&local_30);
  QPDFObjectHandle::~QPDFObjectHandle(&local_30);
  return (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),(char)iVar1) & 0xffffff01;
}

Assistant:

bool
QPDFNameTreeObjectHelper::remove(std::string const& key, QPDFObjectHandle* value)
{
    return m->impl->remove(QPDFObjectHandle::newUnicodeString(key), value);
}